

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiID ImHashStr(char *data_p,size_t data_size,ImU32 seed)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  ulong uVar5;
  char *pcVar6;
  bool bVar7;
  
  uVar3 = ~seed;
  uVar2 = uVar3;
  if (data_size == 0) {
    if (*data_p != 0) {
      pcVar6 = data_p + 2;
      bVar4 = *data_p;
      do {
        bVar1 = pcVar6[-1];
        if ((bVar1 == 0x23 && bVar4 == 0x23) && (*pcVar6 == '#')) {
          uVar2 = uVar3;
        }
        uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[uVar2 & 0xff ^ (uint)bVar4];
        pcVar6 = pcVar6 + 1;
        bVar4 = bVar1;
      } while (bVar1 != 0);
    }
  }
  else {
    uVar5 = data_size - 1;
    pcVar6 = data_p + 2;
    do {
      if (((1 < uVar5 && (byte)pcVar6[-2] == 0x23) && (pcVar6[-1] == '#')) && (*pcVar6 == '#')) {
        uVar2 = uVar3;
      }
      uVar2 = uVar2 >> 8 ^ GCrc32LookupTable[uVar2 & 0xff ^ (uint)(byte)pcVar6[-2]];
      pcVar6 = pcVar6 + 1;
      bVar7 = uVar5 != 0;
      uVar5 = uVar5 - 1;
    } while (bVar7);
  }
  return ~uVar2;
}

Assistant:

ImGuiID ImHashStr(const char* data_p, size_t data_size, ImU32 seed)
{
    seed = ~seed;
    ImU32 crc = seed;
    const unsigned char* data = (const unsigned char*)data_p;
    const ImU32* crc32_lut = GCrc32LookupTable;
    if (data_size != 0)
    {
        while (data_size-- != 0)
        {
            unsigned char c = *data++;
            if (c == '#' && data_size >= 2 && data[0] == '#' && data[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    else
    {
        while (unsigned char c = *data++)
        {
            if (c == '#' && data[0] == '#' && data[1] == '#')
                crc = seed;
            crc = (crc >> 8) ^ crc32_lut[(crc & 0xFF) ^ c];
        }
    }
    return ~crc;
}